

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Chapters::Edition::ParseAtom
          (Edition *this,IMkvReader *pReader,longlong pos,longlong size)

{
  int iVar1;
  Atom *pAVar2;
  bool bVar3;
  Atom *a;
  longlong size_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  Edition *this_local;
  
  bVar3 = ExpandAtomsArray(this);
  if (bVar3) {
    pAVar2 = this->m_atoms;
    iVar1 = this->m_atoms_count;
    this->m_atoms_count = iVar1 + 1;
    Atom::Init(pAVar2 + iVar1);
    this_local = (Edition *)Atom::Parse(pAVar2 + iVar1,pReader,pos,size);
  }
  else {
    this_local = (Edition *)0xffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

long Chapters::Edition::ParseAtom(IMkvReader* pReader, long long pos,
                                  long long size) {
  if (!ExpandAtomsArray())
    return -1;

  Atom& a = m_atoms[m_atoms_count++];
  a.Init();

  return a.Parse(pReader, pos, size);
}